

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

MatchTool * generate_Dtran(MatchTool *__return_storage_ptr__,RegexTree *tree)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  pointer piVar5;
  pointer pDVar6;
  bool bVar7;
  __node_base *p_Var8;
  mapped_type *__x;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  ulong uVar11;
  long lVar12;
  int i;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  pointer pDVar18;
  pointer pDVar19;
  pointer piVar20;
  long lVar21;
  pointer pDVar22;
  vector<int,_std::allocator<int>_> *__x_00;
  __node_base *p_Var23;
  ulong uVar24;
  allocator_type local_2c9;
  vector<int,_std::allocator<int>_> tmp;
  int local_2ac;
  vector<Dstate,_std::allocator<Dstate>_> Dstates;
  value_type_conflict1 local_28c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  Dtran;
  vector<int,_std::allocator<int>_> firstpos;
  vector<int,_std::allocator<int>_> targets;
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> table;
  int j;
  undefined4 uStack_1d4;
  StateMap mp;
  FollowPos fp;
  StateSet first_set;
  tree_node *p;
  _Vector_base<int,_std::allocator<int>_> local_130 [10];
  
  p = (tree_node *)0xffffffff;
  local_130[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Dstate,_std::allocator<Dstate>_>::vector
            (&Dstates,1,(value_type *)&p,(allocator_type *)&mp);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(local_130);
  Dtran.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Dtran.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Dtran.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
  mp._M_h._M_bucket_count = 1;
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mp._M_h._M_element_count = 0;
  mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mp._M_h._M_rehash_policy._M_next_resize = 0;
  mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
  RegexTree::number_node(tree,&mp);
  std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::vector
            (&table,mp._M_h._M_element_count + 1,(allocator_type *)&p);
  p_Var8 = &mp._M_h._M_before_begin;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
    super__Vector_impl_data._M_start
    [(int)((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor] =
         (tree_node *)p_Var8[1]._M_nxt;
  }
  firstpos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  firstpos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  firstpos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  RegexTree::get_followpos(&fp,tree,&mp);
  RegexTree::firstpos(&first_set,tree);
  p_Var23 = &first_set._M_h._M_before_begin;
  while (p_Var23 = p_Var23->_M_nxt, p_Var23 != (__node_base *)0x0) {
    p = *(tree_node **)(p_Var23 + 1);
    __x = std::__detail::
          _Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&mp,&p);
    std::vector<int,_std::allocator<int>_>::push_back(&firstpos,__x);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (firstpos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,firstpos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
               super__Vector_impl_data._M_start)->states,&firstpos);
  p = (tree_node *)mp._M_h._M_element_count;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    (((Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_start)->states).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start,((Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                                super__Vector_impl_data._M_start)->states).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
  if (_Var9._M_current !=
      ((Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.super__Vector_impl_data.
       _M_start)->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p = (tree_node *)CONCAT44(p._4_4_,1);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&targets,(int *)&p);
  }
  local_2ac = 0;
  uVar24 = 0;
  do {
    uVar11 = (long)Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    if (uVar11 <= uVar24) {
      MatchTool::MatchTool(__return_storage_ptr__,&Dtran,&targets);
      std::
      _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&first_set._M_h);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&fp);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&firstpos.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>::~_Vector_base
                (&table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>);
      std::
      _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&mp._M_h);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&targets.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&Dtran);
      std::vector<Dstate,_std::allocator<Dstate>_>::~vector(&Dstates);
      return __return_storage_ptr__;
    }
    pDVar22 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      if (pDVar22->mark == -1) {
        local_2ac = (int)uVar13;
        break;
      }
      pDVar22 = pDVar22 + 1;
    }
    uVar11 = uVar24 + 1;
    Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.super__Vector_impl_data.
    _M_start[local_2ac].mark = (int)uVar11;
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      *(undefined1 *)((long)&p + lVar12) = 0;
    }
    local_130[0]._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT17(1,local_130[0]._M_impl.super__Vector_impl_data._M_start._0_7_);
    piVar3 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
             super__Vector_impl_data._M_start[local_2ac].states.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    uVar13 = uVar24 + 2;
    for (piVar14 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_start[local_2ac].states.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start; uVar24 = uVar11, piVar14 != piVar3; piVar14 = piVar14 + 1) {
      cVar1 = table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar14]->c;
      lVar12 = (long)cVar1;
      if (*(char *)((long)&p + lVar12) == '\0') {
        *(undefined1 *)((long)&p + lVar12) = 1;
        tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        piVar4 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                 super__Vector_impl_data._M_start[local_2ac].states.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar15 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_start[local_2ac].states.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar15 != piVar4; piVar15 = piVar15 + 1) {
          iVar2 = *piVar15;
          if (table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar2]->c == cVar1) {
            piVar5 = fp.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar2].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar20 = fp.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar2].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar20 != piVar5;
                piVar20 = piVar20 + 1) {
              _j = (pointer)CONCAT44(uStack_1d4,*piVar20);
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,
                                  (_Vector_base<int,_std::allocator<int>_> *)&j);
              if (_Var10._M_current ==
                  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish) {
                std::vector<int,_std::allocator<int>_>::push_back(&tmp,(value_type_conflict1 *)&j);
              }
            }
          }
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start,
                   tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_finish);
        pDVar6 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pDVar22 = Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = (long)Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_start;
        lVar21 = 0;
        for (lVar17 = lVar16 >> 7;
            __x_00 = (vector<int,_std::allocator<int>_> *)
                     ((long)&(pDVar22->states).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar21), 0 < lVar17;
            lVar17 = lVar17 + -1) {
          bVar7 = std::operator==(__x_00,&tmp);
          if (bVar7) {
            pDVar19 = (pointer)((long)&pDVar22->mark + lVar21);
            goto LAB_00104cb7;
          }
          bVar7 = std::operator==((vector<int,_std::allocator<int>_> *)
                                  ((long)&pDVar22[1].states.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar21),&tmp);
          if (bVar7) {
            pDVar19 = (pointer)((long)&pDVar22[1].mark + lVar21);
            goto LAB_00104cb7;
          }
          bVar7 = std::operator==((vector<int,_std::allocator<int>_> *)
                                  ((long)&pDVar22[2].states.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar21),&tmp);
          if (bVar7) {
            pDVar19 = (pointer)((long)&pDVar22[2].mark + lVar21);
            goto LAB_00104cb7;
          }
          bVar7 = std::operator==((vector<int,_std::allocator<int>_> *)
                                  ((long)&pDVar22[3].states.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar21),&tmp);
          if (bVar7) {
            pDVar19 = (pointer)((long)&pDVar22[3].mark + lVar21);
            goto LAB_00104cb7;
          }
          lVar21 = lVar21 + 0x80;
        }
        lVar16 = lVar16 - lVar21 >> 5;
        pDVar18 = (pointer)((long)&pDVar22->mark + lVar21);
        if (lVar16 == 1) {
LAB_00104ca3:
          bVar7 = std::operator==(&pDVar18->states,&tmp);
          pDVar19 = pDVar18;
          if (!bVar7) {
            pDVar19 = pDVar6;
          }
        }
        else if (lVar16 == 3) {
          bVar7 = std::operator==(__x_00,&tmp);
          pDVar19 = pDVar18;
          if (!bVar7) {
            pDVar18 = (pointer)((long)&pDVar22[1].mark + lVar21);
            goto LAB_00104c8d;
          }
        }
        else {
          pDVar19 = pDVar6;
          if (lVar16 == 2) {
LAB_00104c8d:
            bVar7 = std::operator==(&pDVar18->states,&tmp);
            pDVar19 = pDVar18;
            if (!bVar7) {
              pDVar18 = pDVar18 + 1;
              goto LAB_00104ca3;
            }
          }
        }
LAB_00104cb7:
        uVar24 = (long)pDVar19 -
                 (long)Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (pDVar19 ==
            Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<Dstate,_std::allocator<Dstate>_>::emplace_back<>(&Dstates);
          _j = (pointer)mp._M_h._M_element_count;
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                            (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             (_Vector_base<int,_std::allocator<int>_> *)&j);
          if (_Var9._M_current !=
              tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            _j = (pointer)CONCAT44(uStack_1d4,
                                   (int)((ulong)((long)Dstates.
                                                  super__Vector_base<Dstate,_std::allocator<Dstate>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)Dstates.
                                                  super__Vector_base<Dstate,_std::allocator<Dstate>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&targets,&j);
          }
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    (&Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].states,&tmp);
        }
        if ((ulong)(((long)Dtran.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)Dtran.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) < uVar13) {
          local_28c = 0;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&j,0x100,&local_28c,&local_2c9);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(&Dtran,uVar13,(value_type *)&j);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&j);
        }
        Dtran.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar12] = (int)(uVar24 >> 5) + 1;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&tmp.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
  } while( true );
}

Assistant:

MatchTool generate_Dtran(const RegexTree& tree) {
    std::vector<Dstate> Dstates(1, Dstate());
    std::vector<std::vector<int>> Dtran;
    std::vector<int> targets;
    RegexTree::StateMap mp;
    tree.number_node(mp);
    std::vector<const tree_node *> table(mp.size() + 1);
    for (const auto &p : mp)
        table[p.second] = p.first;
    std::vector<int> firstpos;
    RegexTree::FollowPos fp = tree.get_followpos(mp);
    int is_marked = 0;
    int curr = 0;

    RegexTree::StateSet first_set = tree.firstpos();
    for (const tree_node *p : first_set) firstpos.push_back(mp.at(p));
    std::sort(firstpos.begin(), firstpos.end());
    Dstates.front().states = firstpos;
    if (std::find(Dstates.front().states.cbegin(),
            Dstates.front().states.cend(), mp.size()) != Dstates.front().states.cend())
        targets.push_back(1);

    while (is_marked < Dstates.size()) {
        for (int i = 0; i < Dstates.size(); i++)
            if (Dstates[i].mark == -1) {
                curr = i;
                break;
            }
        ++is_marked;
        Dstates[curr].mark = is_marked; // mark this state

        bool alphabet[256];
        for (bool &i : alphabet)
            i = false;
        alphabet[ACCEPT] = true;

        for (int state : Dstates[curr].states) {
            char ch = table[state]->c;
            if (alphabet[ch])
                continue;
            else
                alphabet[ch] = true;

            std::vector<int> tmp;
            for (int state2 : Dstates[curr].states) {
                if (table[state2]->c == ch)
                    for (int j : fp[state2]) {
                        if (std::find(tmp.begin(), tmp.end(), j) == tmp.end())
                            tmp.push_back(j);
                    }
            }
            std::sort(tmp.begin(), tmp.end());

            auto iter = std::find_if(Dstates.begin(), Dstates.end(), [&tmp](Dstate &s) {
                return s.states == tmp;
            });
            int state_num = static_cast<int>(iter - Dstates.begin()) + 1;
            if (iter == Dstates.end()) {
                Dstates.emplace_back();
                if (std::find(tmp.cbegin(), tmp.cend(), mp.size()) != tmp.cend())
                    targets.push_back(static_cast<int>(Dstates.size()));
                Dstates.back().states = std::move(tmp);
            }
            if (Dtran.size() < is_marked + 1)
                Dtran.resize(static_cast<unsigned long>(is_marked + 1) // NOLINT
                        , std::vector<int>(256, 0));
            Dtran[is_marked][ch] = state_num;
        }
    }
    return MatchTool(std::move(Dtran), std::move(targets));
}